

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

bool embree::endsWith(string *str,string *suffix)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  if (str->_M_string_length < suffix->_M_string_length ||
      str->_M_string_length == suffix->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)str);
    if (local_30 == suffix->_M_string_length) {
      if (local_30 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38,(suffix->_M_dataplus)._M_p,local_30);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar2;
}

Assistant:

bool endsWith(std::string const &str, std::string const &suffix)
{
  if (str.length() <= suffix.length())
    return false;
  return str.substr(str.length() - suffix.length(), str.length() - 1) == suffix;
}